

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O2

void __thiscall rsg::ExecutionContext::~ExecutionContext(ExecutionContext *this)

{
  _Base_ptr this_00;
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_varValues)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
                ((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)this_00);
    }
    operator_delete(this_00,0x18);
  }
  std::
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::clear((_Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
           *)this);
  std::_Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>::~_Vector_base
            (&(this->m_execMaskStack).
              super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>);
  std::
  _Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::~_Rb_tree((_Rb_tree<const_rsg::Variable_*,_std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>,_std::_Select1st<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
               *)this);
  return;
}

Assistant:

ExecutionContext::~ExecutionContext (void)
{
	for (VarValueMap::iterator i = m_varValues.begin(); i != m_varValues.end(); i++)
		delete i->second;
	m_varValues.clear();
}